

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<std::vector<char,_std::allocator<char>_>_> *
wasm::WATParser::datastring<wasm::WATParser::ParseDeclsCtx>
          (Result<std::vector<char,_std::allocator<char>_>_> *__return_storage_ptr__,
          ParseDeclsCtx *ctx)

{
  pointer *this;
  string_view str_00;
  undefined1 auStack_68 [8];
  vector<char,_std::allocator<char>_> data;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  
  auStack_68 = (undefined1  [8])0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  this = &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  while( true ) {
    Lexer::takeString_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,&ctx->in);
    if (str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ == '\0') break;
    str_00._M_str =
         data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    str_00._M_len =
         (size_t)str.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    ParseDeclsCtx::appendDataString(ctx,(vector<char,_std::allocator<char>_> *)auStack_68,str_00);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  *(undefined1 (*) [8])
   &(__return_storage_ptr__->val).
    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
    super__Move_assign_alias<std::vector<char>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<char>,_wasm::Err> = auStack_68;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err> + 8) =
       data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  ;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err> + 0x10) =
       data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  auStack_68 = (undefined1  [8])0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err> + 0x20) = '\0';
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::DataStringT> datastring(Ctx& ctx) {
  auto data = ctx.makeDataString();
  while (auto str = ctx.in.takeString()) {
    ctx.appendDataString(data, *str);
  }
  return data;
}